

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  cmState *pcVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  ostream *poVar9;
  reference pbVar10;
  string local_2a0 [8];
  string path_1;
  string path;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  const_iterator currentEntry;
  iterator iStack_240;
  CacheEntryType t;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  undefined1 local_1d8 [8];
  RegularExpression regex;
  string entryPattern;
  char *v;
  string cachedValue;
  undefined1 local_b8 [3];
  bool haveValue;
  CacheEntryType type;
  string value;
  string var;
  undefined1 local_68 [8];
  string entry;
  string arg;
  uint i;
  bool findPackageMode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  bVar2 = false;
  for (arg.field_2._8_4_ = 1;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), (uint)arg.field_2._8_4_ < sVar4;
      arg.field_2._8_4_ = arg.field_2._8_4_ + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
    std::__cxx11::string::string((string *)(entry.field_2._M_local_buf + 8),(string *)pvVar5);
    lVar6 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8de575);
    if (lVar6 == 0) {
      std::__cxx11::string::substr((ulong)local_68,(ulong)((long)&entry.field_2 + 8));
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
LAB_00564c19:
        std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_b8);
        cachedValue.field_2._12_4_ = 6;
        bVar3 = cmCacheManager::ParseEntry
                          ((string *)local_68,(string *)(value.field_2._M_local_buf + 8),
                           (string *)local_b8,
                           (CacheEntryType *)(cachedValue.field_2._M_local_buf + 0xc));
        if (bVar3) {
          cachedValue.field_2._M_local_buf[0xb] = '\0';
          std::__cxx11::string::string((string *)&v);
          if (((this->WarnUnusedCli & 1U) != 0) &&
             (pcVar8 = cmState::GetInitializedCacheValue
                                 (this->State,(string *)((long)&value.field_2 + 8)),
             pcVar8 != (char *)0x0)) {
            cachedValue.field_2._M_local_buf[0xb] = '\x01';
            std::__cxx11::string::operator=((string *)&v,pcVar8);
          }
          pcVar1 = this->State;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmState::AddCacheEntry
                    (pcVar1,(string *)((long)&value.field_2 + 8),pcVar8,
                     "No help, variable specified on the command line.",cachedValue.field_2._12_4_);
          if ((this->WarnUnusedCli & 1U) != 0) {
            if ((cachedValue.field_2._M_local_buf[0xb] & 1U) != 0) {
              pcVar8 = cmState::GetInitializedCacheValue
                                 (this->State,(string *)((long)&value.field_2 + 8));
              bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&v,pcVar8);
              if (!bVar3) goto LAB_00564df1;
            }
            WatchUnusedCli(this,(string *)((long)&value.field_2 + 8));
          }
LAB_00564df1:
          std::__cxx11::string::~string((string *)&v);
          bVar3 = false;
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cerr,"Parse error in command line argument: ");
          poVar9 = std::operator<<(poVar9,(string *)(entry.field_2._M_local_buf + 8));
          poVar9 = std::operator<<(poVar9,"\n");
          std::operator<<(poVar9,"Should be: VAR:type=value\n");
          cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar3 = true;
        }
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      }
      else {
        arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if ((uint)arg.field_2._8_4_ < sVar4) {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
          std::__cxx11::string::operator=((string *)local_68,(string *)pvVar5);
          goto LAB_00564c19;
        }
        cmSystemTools::Error
                  ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        this_local._7_1_ = 0;
        bVar3 = true;
      }
      std::__cxx11::string::~string((string *)local_68);
joined_r0x00565468:
      if (!bVar3) goto LAB_005655d0;
    }
    else {
      lVar6 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8ba45e);
      if (lVar6 == 0) {
        this->SuppressDevWarnings = true;
        this->DoSuppressDevWarnings = true;
      }
      else {
        lVar6 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8ba484);
        if (lVar6 != 0) {
          lVar6 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8ca82d);
          if (lVar6 == 0) {
            std::__cxx11::string::substr
                      ((ulong)&regex.searchstring,(ulong)((long)&entry.field_2 + 8));
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
LAB_00565021:
              cmsys::Glob::PatternToRegex
                        ((string *)
                         &entriesToDelete.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (string *)&regex.searchstring,true,true);
              pcVar8 = (char *)std::__cxx11::string::c_str();
              cmsys::RegularExpression::RegularExpression((RegularExpression *)local_1d8,pcVar8);
              std::__cxx11::string::~string
                        ((string *)
                         &entriesToDelete.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cacheKeys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
              cmState::GetCacheEntryKeys_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&it,this->State);
              local_238._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&it);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::__normal_iterator<std::__cxx11::string*>
                        ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&local_230,&local_238);
              while( true ) {
                iStack_240 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&it);
                bVar3 = __gnu_cxx::operator!=(&local_230,&stack0xfffffffffffffdc0);
                if (!bVar3) break;
                pcVar1 = this->State;
                pbVar10 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_230);
                currentEntry._M_current._4_4_ = cmState::GetCacheEntryType(pcVar1,pbVar10);
                if (currentEntry._M_current._4_4_ != STATIC) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator->(&local_230);
                  pcVar8 = (char *)std::__cxx11::string::c_str();
                  bVar3 = cmsys::RegularExpression::find((RegularExpression *)local_1d8,pcVar8);
                  if (bVar3) {
                    pbVar10 = __gnu_cxx::
                              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&local_230);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&cacheKeys.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar10);
                  }
                }
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_230);
              }
              local_258._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&cacheKeys.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::__normal_iterator<std::__cxx11::string*>
                        ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&local_250,&local_258);
              while( true ) {
                path.field_2._8_8_ =
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&cacheKeys.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                bVar3 = __gnu_cxx::operator!=
                                  (&local_250,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&path.field_2 + 8));
                if (!bVar3) break;
                pcVar1 = this->State;
                pbVar10 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_250);
                cmState::RemoveCacheEntry(pcVar1,pbVar10);
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_250);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&it);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&cacheKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_1d8);
              bVar3 = false;
            }
            else {
              arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(args);
              if ((uint)arg.field_2._8_4_ < sVar4) {
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
                std::__cxx11::string::operator=((string *)&regex.searchstring,(string *)pvVar5);
                goto LAB_00565021;
              }
              cmSystemTools::Error
                        ("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
              this_local._7_1_ = 0;
              bVar3 = true;
            }
            std::__cxx11::string::~string((string *)&regex.searchstring);
            goto joined_r0x00565468;
          }
          lVar6 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8bf8d4);
          if (lVar6 == 0) {
            std::__cxx11::string::substr
                      ((ulong)((long)&path_1.field_2 + 8),(ulong)((long)&entry.field_2 + 8));
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
LAB_005653d4:
              poVar9 = std::operator<<((ostream *)&std::cout,"loading initial cache file ");
              poVar9 = std::operator<<(poVar9,(string *)(path_1.field_2._M_local_buf + 8));
              std::operator<<(poVar9,"\n");
              pcVar8 = (char *)std::__cxx11::string::c_str();
              ReadListFile(this,args,pcVar8);
              bVar3 = false;
            }
            else {
              arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(args);
              if ((uint)arg.field_2._8_4_ < sVar4) {
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
                std::__cxx11::string::operator=
                          ((string *)(path_1.field_2._M_local_buf + 8),(string *)pvVar5);
                goto LAB_005653d4;
              }
              cmSystemTools::Error
                        ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
              this_local._7_1_ = 0;
              bVar3 = true;
            }
            std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
            goto joined_r0x00565468;
          }
          lVar6 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8ba147);
          if (lVar6 != 0) {
            lVar6 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8ba14a);
            if (lVar6 == 0) {
              bVar2 = true;
            }
            goto LAB_005655d0;
          }
          arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if ((uint)arg.field_2._8_4_ < sVar4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
            std::__cxx11::string::string(local_2a0,(string *)pvVar5);
            uVar7 = std::__cxx11::string::empty();
            bVar3 = (uVar7 & 1) != 0;
            if (bVar3) {
              cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
              this_local._7_1_ = 0;
            }
            else {
              pcVar8 = (char *)std::__cxx11::string::c_str();
              ReadListFile(this,args,pcVar8);
            }
            std::__cxx11::string::~string(local_2a0);
            goto joined_r0x00565468;
          }
          cmSystemTools::Error
                    ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar3 = true;
          goto LAB_005655d7;
        }
        this->SuppressDevWarnings = false;
        this->DoSuppressDevWarnings = true;
      }
LAB_005655d0:
      bVar3 = false;
    }
LAB_005655d7:
    std::__cxx11::string::~string((string *)(entry.field_2._M_local_buf + 8));
    if (bVar3) goto LAB_00565627;
  }
  if (bVar2) {
    this_local._7_1_ = FindPackage(this,args);
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_00565627:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-D",0) == 0)
      {
      std::string entry = arg.substr(2);
      if(entry.empty())
        {
        ++i;
        if(i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
          }
        }
      std::string var, value;
      cmState::CacheEntryType type = cmState::UNINITIALIZED;
      if(cmCacheManager::ParseEntry(entry, var, value, type))
        {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if(this->WarnUnusedCli)
          {
          if(const char *v = this->State->GetInitializedCacheValue(var))
            {
            haveValue = true;
            cachedValue = v;
            }
          }

        this->State->AddCacheEntry(var, value.c_str(),
          "No help, variable specified on the command line.", type);

        if(this->WarnUnusedCli)
          {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var))
            {
            this->WatchUnusedCli(var);
            }
          }
        }
      else
        {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      }
    else if(arg.find("-Wno-dev",0) == 0)
      {
      this->SuppressDevWarnings = true;
      this->DoSuppressDevWarnings = true;
      }
    else if(arg.find("-Wdev",0) == 0)
      {
      this->SuppressDevWarnings = false;
      this->DoSuppressDevWarnings = true;
      }
    else if(arg.find("-U",0) == 0)
      {
      std::string entryPattern = arg.substr(2);
      if(entryPattern.empty())
        {
        ++i;
        if(i < args.size())
          {
          entryPattern = args[i];
          }
        else
          {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
          }
        }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      //go through all cache entries and collect the vars which will be removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
            it != cacheKeys.end(); ++it)
        {
        cmState::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if(t != cmState::STATIC)
          {
          if (regex.find(it->c_str()))
            {
            entriesToDelete.push_back(*it);
            }
          }
        }

      // now remove them from the cache
      for(std::vector<std::string>::const_iterator currentEntry =
          entriesToDelete.begin();
          currentEntry != entriesToDelete.end();
          ++currentEntry)
        {
        this->State->RemoveCacheEntry(*currentEntry);
        }
      }
    else if(arg.find("-C",0) == 0)
      {
      std::string path = arg.substr(2);
      if (path.empty())
        {
        ++i;
        if(i < args.size())
          {
          path = args[i];
          }
        else
          {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
          }
        }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
      }
    else if(arg.find("-P",0) == 0)
      {
      i++;
      if(i >= args.size())
        {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
        }
      std::string path = args[i];
      if (path.empty())
        {
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      this->ReadListFile(args, path.c_str());
      }
    else if (arg.find("--find-package",0) == 0)
      {
      findPackageMode = true;
      }
    }

  if (findPackageMode)
    {
    return this->FindPackage(args);
    }

  return true;
}